

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Byte.cpp
# Opt level: O0

void cplus::lang::Byte::binToString(char value,char *buffer)

{
  char local_27;
  char local_25;
  char local_23;
  char local_21;
  char local_1f;
  char local_1d;
  char local_1b;
  char local_19;
  char *buffer_local;
  char value_local;
  
  local_19 = '0';
  if ((value & 1U) != 0) {
    local_19 = '1';
  }
  buffer[7] = local_19;
  local_1b = '0';
  if ((value & 2U) != 0) {
    local_1b = '1';
  }
  buffer[6] = local_1b;
  local_1d = '0';
  if ((value & 4U) != 0) {
    local_1d = '1';
  }
  buffer[5] = local_1d;
  local_1f = '0';
  if ((value & 8U) != 0) {
    local_1f = '1';
  }
  buffer[4] = local_1f;
  local_21 = '0';
  if ((value & 0x10U) != 0) {
    local_21 = '1';
  }
  buffer[3] = local_21;
  local_23 = '0';
  if ((value & 0x20U) != 0) {
    local_23 = '1';
  }
  buffer[2] = local_23;
  local_25 = '0';
  if ((value & 0x40U) != 0) {
    local_25 = '1';
  }
  buffer[1] = local_25;
  local_27 = '0';
  if (((int)value & 0x80U) != 0) {
    local_27 = '1';
  }
  *buffer = local_27;
  return;
}

Assistant:

void Byte::binToString(char value, char *buffer) {
			buffer[7] = ((value & 0x1) == 0 ? '0' : '1');
			buffer[6] = ((value & 0x2) == 0 ? '0' : '1');
			buffer[5] = ((value & 0x4) == 0 ? '0' : '1');
			buffer[4] = ((value & 0x8) == 0 ? '0' : '1');
			buffer[3] = ((value & 0x10) == 0 ? '0' : '1');
			buffer[2] = ((value & 0x20) == 0 ? '0' : '1');
			buffer[1] = ((value & 0x40) == 0 ? '0' : '1');
			buffer[0] = ((value & 0x80) == 0 ? '0' : '1');
		}